

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode JsCreateString(char *content,size_t length,JsValueRef *value)

{
  anon_class_24_3_37336f0d fn;
  JsValueRef *local_28;
  JsValueRef *value_local;
  size_t length_local;
  char *content_local;
  
  if (content == (char *)0x0) {
    content_local._4_4_ = JsErrorNullArgument;
  }
  else if (value == (JsValueRef *)0x0) {
    content_local._4_4_ = JsErrorNullArgument;
  }
  else {
    *value = (JsValueRef)0x0;
    local_28 = value;
    value_local = (JsValueRef *)length;
    length_local = (size_t)content;
    if (length == 0xffffffffffffffff) {
      value_local = (JsValueRef *)strlen(content);
    }
    if (value_local < (JsValueRef *)0x7fffffff) {
      fn.length = (size_t *)&value_local;
      fn.content = (char **)&length_local;
      fn.value = &local_28;
      content_local._4_4_ = ContextAPINoScriptWrapper<JsCreateString::__0>(fn,false,false);
    }
    else {
      content_local._4_4_ = JsErrorOutOfMemory;
    }
  }
  return content_local._4_4_;
}

Assistant:

CHAKRA_API JsCreateString(
    _In_ const char *content,
    _In_ size_t length,
    _Out_ JsValueRef *value)
{
    PARAM_NOT_NULL(content);
    PARAM_NOT_NULL(value);
    *value = JS_INVALID_REFERENCE;

    if (length == static_cast<size_t>(-1))
    {
        length = strlen(content);
    }

    if (length > MaxCharCount)
    {
        return JsErrorOutOfMemory;
    }

    return ContextAPINoScriptWrapper([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {

        Js::JavascriptString *stringValue = Js::LiteralStringWithPropertyStringPtr::
            NewFromCString(content, (CharCount)length, scriptContext->GetLibrary());

        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTCreateString, stringValue->GetSz(), stringValue->GetLength());

        *value = stringValue;

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, value);

        return JsNoError;
    });
}